

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

void Gia_ManDupFadd(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vChain,Vec_Int_t *vFadds,Vec_Int_t *vMap
                   ,Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int pLits [3];
  
  iVar3 = -1;
  for (iVar10 = 0; uVar6 = vChain->nSize, iVar10 < (int)uVar6; iVar10 = iVar10 + 1) {
    iVar3 = Vec_IntEntry(vChain,iVar10);
    for (iVar8 = 0; iVar8 != 3; iVar8 = iVar8 + 1) {
      if (iVar10 == 0 || iVar8 != 0) {
        iVar4 = Vec_IntEntry(vFadds,iVar3 * 5 + iVar8);
        pGVar7 = Gia_ManObj(p,iVar4);
        Gia_ManDupWithFaddBoxes_rec(pNew,p,pGVar7,vFadds,vMap,vChains,vMap2Chain,vTruths);
      }
    }
  }
  iVar10 = 0;
  uVar11 = 0;
  do {
    if ((int)uVar6 <= iVar10) {
      if ((int)uVar6 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
      }
      if (iVar3 != vChain->pArray[(ulong)uVar6 - 1]) {
        __assert_fail("iFadd == Vec_IntEntryLast(vChain)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x2fd,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar3 = Vec_IntEntry(vFadds,iVar3 * 5 + 4);
      pGVar7 = Gia_ManObj(p,iVar3);
      pGVar7->Value = uVar11;
      return;
    }
    iVar3 = Vec_IntEntry(vChain,iVar10);
    uVar5 = Vec_IntEntry(vTruths,iVar3 * 2);
    uVar6 = Vec_IntEntry(vTruths,iVar3 * 2 + 1);
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      iVar8 = Vec_IntEntry(vFadds,iVar3 * 5 + (int)lVar9);
      pGVar7 = Gia_ManObj(p,iVar8);
      if (((lVar9 != 0) || (uVar2 = uVar11, uVar11 == 0)) &&
         (uVar1 = pGVar7->Value, pLits[lVar9] = uVar1, uVar2 = pLits[0], (int)uVar1 < 0)) {
        __assert_fail("pLits[k] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                      ,0x2d6,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pLits[0] = uVar2;
    }
    if (uVar6 != 0x17) {
      if (uVar6 == 0x2b) {
        pLits[1] = Abc_LitNot(pLits[1]);
LAB_00539895:
        uVar5 = uVar5 ^ 0xff;
LAB_0053989d:
        pLits[2] = Abc_LitNot(pLits[2]);
        uVar11 = ~uVar5;
LAB_005398b4:
        uVar5 = uVar11 & 0xff;
        uVar6 = 0xe8;
      }
      else if (uVar6 != 0xe8) {
        uVar11 = ~uVar5;
        if (uVar6 != 0x71) {
          if (uVar6 == 0x8e) goto LAB_0053989d;
          if (uVar6 == 0xb2) {
            pLits[1] = Abc_LitNot(pLits[1]);
          }
          else {
            if (uVar6 != 0xd4) {
              if (uVar6 != 0x4d) {
                __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                              ,0x2e7,
                              "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                             );
              }
              pLits[0] = Abc_LitNot(pLits[0]);
              goto LAB_00539895;
            }
            pLits[0] = Abc_LitNot(pLits[0]);
          }
          goto LAB_005398b4;
        }
        pLits[2] = Abc_LitNot(pLits[2]);
        uVar5 = uVar11 & 0xff;
        uVar6 = 0x17;
      }
    }
    iVar8 = pLits[0];
    iVar4 = Abc_LitIsCompl(pLits[0]);
    if (iVar4 != 0) {
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        iVar8 = Abc_LitNot(pLits[lVar9]);
        pLits[lVar9] = iVar8;
      }
      uVar5 = ~uVar5 & 0xff;
      uVar6 = ~uVar6 & 0xff;
      iVar8 = pLits[0];
    }
    iVar8 = Abc_LitIsCompl(iVar8);
    if (iVar8 != 0) {
      __assert_fail("!Abc_LitIsCompl(pLits[0])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2f1,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      Gia_ManAppendCo(pNew,pLits[lVar9]);
    }
    if ((uVar5 != 0x69) && (uVar5 != 0x96)) {
      __assert_fail("iXorTruth == 0x96 || iXorTruth == 0x69",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2f5,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar8 = Vec_IntEntry(vFadds,iVar3 * 5 + 3);
    pGVar7 = Gia_ManObj(p,iVar8);
    iVar8 = Gia_ManAppendCi(pNew);
    uVar11 = Abc_LitNotCond(iVar8,(uint)(uVar5 == 0x69));
    pGVar7->Value = uVar11;
    if ((uVar6 != 0x17) && (uVar6 != 0xe8)) {
      __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecFadds.c"
                    ,0x2f9,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar8 = Gia_ManAppendCi(pNew);
    uVar11 = Abc_LitNotCond(iVar8,(uint)(uVar6 == 0x17));
    iVar10 = iVar10 + 1;
    uVar6 = vChain->nSize;
  } while( true );
}

Assistant:

void Gia_ManDupFadd( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vChain, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    extern void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths );
    int i, k, iFadd = -1, iCiLit, pLits[3];
    Gia_Obj_t * pObj;
    // construct FADD inputs
    Vec_IntForEachEntry( vChain, iFadd, i )
        for ( k = 0; k < 3; k++ )
        {
            if ( i && !k ) continue;
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            Gia_ManDupWithFaddBoxes_rec( pNew, p, pObj, vFadds, vMap, vChains, vMap2Chain, vTruths );
        }
    // construct boxes
    iCiLit = 0;
    Vec_IntForEachEntry( vChain, iFadd, i )
    {
        int iXorTruth = Vec_IntEntry( vTruths, 2*iFadd+0 );
        int iMajTruth = Vec_IntEntry( vTruths, 2*iFadd+1 );
        for ( k = 0; k < 3; k++ )
        {
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            pLits[k] = (!k && iCiLit) ? iCiLit : pObj->Value;
            assert( pLits[k] >= 0 );
        }
        // normalize truth table
        //    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
        //         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        if ( iMajTruth == 0x4D )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xD4 )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x2B )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xB2 )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        if ( iMajTruth == 0x8E )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x71 )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0x17, iXorTruth = 0xFF & ~iXorTruth;
        else assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        // normalize carry-in
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            for ( k = 0; k < 3; k++ )
                pLits[k] = Abc_LitNot(pLits[k]);
            iXorTruth = 0xFF & ~iXorTruth;
            iMajTruth = 0xFF & ~iMajTruth;
        }
        // add COs
        assert( !Abc_LitIsCompl(pLits[0]) );
        for ( k = 0; k < 3; k++ )
            Gia_ManAppendCo( pNew, pLits[k] );
        // create CI
        assert( iXorTruth == 0x96 || iXorTruth == 0x69 );
        pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iXorTruth == 0x69) );
        // create CI
        assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        iCiLit = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iMajTruth == 0x17) );
    }   
    // assign carry out
    assert( iFadd == Vec_IntEntryLast(vChain) );
    pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
    pObj->Value = iCiLit;
}